

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vic20.cpp
# Opt level: O3

bool __thiscall Commodore::Vic20::ConcreteMachine::insert_media(ConcreteMachine *this,Media *media)

{
  pointer psVar1;
  element_type *this_00;
  pointer psVar2;
  Machine *this_01;
  pointer psVar3;
  ushort uVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  pointer puVar9;
  uint uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> rom_image;
  shared_ptr<Storage::Disk::Disk> local_58;
  shared_ptr<Storage::Tape::Tape> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  psVar1 = (media->tapes).
           super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar1 != (media->tapes).
                super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (this->tape_).
              super___shared_ptr<Storage::Tape::BinaryTapePlayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar1->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (psVar1->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Storage::Tape::TapePlayer::set_tape(&this_00->super_TapePlayer,&local_48);
    if (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  psVar2 = (media->disks).
           super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((psVar2 != (media->disks).
                 super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
     (this_01 = (this->c1540_).
                super___shared_ptr<Commodore::C1540::Machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     this_01 != (Machine *)0x0)) {
    local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar2->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (psVar2->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    C1540::Machine::set_disk(this_01,&local_58);
    if (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  psVar3 = (media->cartridges).
           super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar3 != (media->cartridges).
                super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    this->rom_address_ = 0xa000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_38,
               &((((psVar3->
                   super___shared_ptr<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->segments_).
                 super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->data);
    this->rom_length_ =
         (short)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (short)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->rom_,&local_38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->rom_,0x2000);
    auVar7 = _DAT_00463a50;
    auVar6 = _DAT_00463a40;
    if (0x3ff < this->rom_length_) {
      puVar9 = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar10 = (this->rom_length_ >> 10) - 1 & 0xffff;
      auVar12._4_4_ = 0;
      auVar12._0_4_ = uVar10;
      auVar12._8_4_ = uVar10;
      auVar12._12_4_ = 0;
      uVar4 = this->rom_address_ >> 10;
      uVar11 = 0;
      auVar12 = auVar12 | _DAT_00463a50;
      do {
        auVar13._8_4_ = (int)puVar9;
        auVar13._0_8_ = puVar9;
        auVar13._12_4_ = (int)((ulong)puVar9 >> 0x20);
        auVar14._8_4_ = (int)uVar11;
        auVar14._0_8_ = uVar11;
        auVar14._12_4_ = (int)(uVar11 >> 0x20);
        auVar14 = (auVar14 | auVar6) ^ auVar7;
        if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                    auVar12._4_4_ < auVar14._4_4_) & 1)) {
          this->processor_read_memory_map_[uVar4 + uVar11] = puVar9;
        }
        if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
            auVar14._12_4_ <= auVar12._12_4_) {
          this->processor_read_memory_map_[(ulong)uVar4 + uVar11 + 1] =
               (uint8_t *)(auVar13._8_8_ + 0x400);
        }
        uVar11 = uVar11 + 2;
        puVar9 = puVar9 + 0x800;
      } while ((uVar10 + 2 & 0xfffffffe) != uVar11);
    }
    pvVar5 = (void *)CONCAT44(local_38.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_38.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,(long)local_38.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5
                     );
    }
  }
  if ((this->tape_is_sleeping_ == false) && (this->allow_fast_tape_hack_ == true)) {
    bVar8 = Storage::Tape::TapePlayer::has_tape
                      (&((this->tape_).
                         super___shared_ptr<Storage::Tape::BinaryTapePlayer,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super_TapePlayer);
  }
  else {
    bVar8 = false;
  }
  this->use_fast_tape_hack_ = bVar8;
  bVar8 = true;
  if (((media->tapes).
       super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (media->tapes).
       super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (((media->disks).
       super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (media->disks).
       super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ||
      ((this->c1540_).super___shared_ptr<Commodore::C1540::Machine,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr == (element_type *)0x0)))) {
    bVar8 = (media->cartridges).
            super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (media->cartridges).
            super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  return bVar8;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			if(!media.tapes.empty()) {
				tape_->set_tape(media.tapes.front());
			}

			if(!media.disks.empty() && c1540_) {
				c1540_->set_disk(media.disks.front());
			}

			if(!media.cartridges.empty()) {
				rom_address_ = 0xa000;
				std::vector<uint8_t> rom_image = media.cartridges.front()->get_segments().front().data;
				rom_length_ = uint16_t(rom_image.size());

				rom_ = rom_image;
				rom_.resize(0x2000);
				write_to_map(processor_read_memory_map_, rom_.data(), rom_address_, rom_length_);
			}

			set_use_fast_tape();

			return !media.tapes.empty() || (!media.disks.empty() && c1540_ != nullptr) || !media.cartridges.empty();
		}